

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  int iVar1;
  string<unsigned_long> local_28;
  unsigned_long *local_18;
  unsigned_long *pBeginClose;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  pBeginClose = (unsigned_long *)this;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  this->P = this->P + 1;
  local_18 = this->P;
  while (*this->P != 0x3e) {
    this->P = this->P + 1;
  }
  while (iVar1 = isspace((int)this->P[-1]), iVar1 != 0) {
    this->P = this->P + -1;
  }
  core::string<unsigned_long>::string<unsigned_long>
            (&local_28,local_18,(s32)((ulong)((long)this->P - (long)local_18) >> 3));
  core::string<unsigned_long>::operator=(&this->NodeName,&local_28);
  core::string<unsigned_long>::~string(&local_28);
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}